

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::LoadSlotArrayWithCachedLocalType
          (Lowerer *this,Instr *instrInsert,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  bool bVar2;
  DWORD offset;
  RegOpnd *baseOpnd;
  StackSym *sym;
  undefined4 *puVar3;
  RegOpnd *this_00;
  IndirOpnd *src;
  
  baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
  if (((propertySymOpnd->field_0x61 & 1) != 0) &&
     (propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0)) {
    if (((ushort)propertySymOpnd->field_12 & 0xc) == 0) {
      this_00 = IR::RegOpnd::New(TyInt64,this->m_func);
    }
    else {
      sym = IR::PropertySymOpnd::GetAuxSlotPtrSym(propertySymOpnd);
      if (sym == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6f03,"(auxSlotPtrSym != nullptr)","auxSlotPtrSym != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      this_00 = IR::RegOpnd::New(sym,TyInt64,this->m_func);
      IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,true);
      if (((ushort)propertySymOpnd->field_12 & 8) == 0) {
        return &this_00->super_Opnd;
      }
    }
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    src = IR::IndirOpnd::New(baseOpnd,offset,TyInt64,this->m_func,false);
    InsertMove(&this_00->super_Opnd,&src->super_Opnd,instrInsert,true);
    baseOpnd = this_00;
  }
  return &baseOpnd->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadSlotArrayWithCachedLocalType(IR::Instr * instrInsert, IR::PropertySymOpnd *propertySymOpnd)
{
    IR::RegOpnd *opndBase = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
    if (propertySymOpnd->UsesAuxSlot())
    {
        // If we use the auxiliary slot array, load it and return it
        IR::RegOpnd * opndSlotArray;
        if (propertySymOpnd->IsAuxSlotPtrSymAvailable() || propertySymOpnd->ProducesAuxSlotPtr())
        {
            // We want to reload and/or reuse the shared aux slot ptr sym
            StackSym * auxSlotPtrSym = propertySymOpnd->GetAuxSlotPtrSym();
            Assert(auxSlotPtrSym != nullptr);

            opndSlotArray = IR::RegOpnd::New(auxSlotPtrSym, TyMachReg, this->m_func);
            opndSlotArray->SetIsJITOptimizedReg(true);
            if (!propertySymOpnd->ProducesAuxSlotPtr())
            {
                // No need to reload
                return opndSlotArray;
            }
        }
        else
        {
            opndSlotArray = IR::RegOpnd::New(TyMachReg, this->m_func);
        }
        IR::Opnd *opndIndir = IR::IndirOpnd::New(opndBase, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func);
        Lowerer::InsertMove(opndSlotArray, opndIndir, instrInsert);

        return opndSlotArray;
    }
    else
    {
        // If we use inline slot return the address to the object header
        return opndBase;
    }
}